

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d717::VectorMerge<long_double>::Run
          (VectorMerge<long_double> *this,istream *input_stream,istream *insert_stream,
          bool *eof_reached)

{
  __normal_iterator<const_long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  __first;
  int_type iVar1;
  int iVar2;
  vector<long_double,_std::allocator<long_double>_> *sequence_to_write;
  int *actual_write_size;
  long in_RCX;
  vector<long_double,_std::allocator<long_double>_> *in_RDI;
  bool bVar3;
  vector<long_double,_std::allocator<long_double>_> garbage;
  vector<long_double,_std::allocator<long_double>_> merged_vector;
  vector<long_double,_std::allocator<long_double>_> *in_stack_fffffffffffffef8;
  difference_type in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  size_type in_stack_ffffffffffffff18;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> __result
  ;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ostream *output_stream;
  istream *input_stream_00;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_ffffffffffffff70;
  ostream local_71 [48];
  istream local_41 [25];
  long local_28;
  byte local_1;
  
  if ((((ulong)in_RDI[1].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish & 1) == 0) ||
     (((ulong)in_RDI[1].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x100) != 0)) {
    sequence_to_write =
         (vector<long_double,_std::allocator<long_double>_> *)
         (long)*(int *)((long)&(in_RDI->
                               super__Vector_base<long_double,_std::allocator<long_double>_>).
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    input_stream_00 = local_41;
    local_28 = in_RCX;
    std::allocator<long_double>::allocator((allocator<long_double> *)0x10c082);
    std::vector<long_double,_std::allocator<long_double>_>::vector
              ((vector<long_double,_std::allocator<long_double>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<long_double>::~allocator((allocator<long_double> *)0x10c0a8);
    actual_write_size =
         (int *)(long)*(int *)((long)&in_RDI[1].
                                      super__Vector_base<long_double,_std::allocator<long_double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 4);
    output_stream = local_71;
    std::allocator<long_double>::allocator((allocator<long_double> *)0x10c0c8);
    std::vector<long_double,_std::allocator<long_double>_>::vector
              ((vector<long_double,_std::allocator<long_double>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<long_double>::~allocator((allocator<long_double> *)0x10c0ee);
    do {
      if (0 < *(int *)&(in_RDI->super__Vector_base<long_double,_std::allocator<long_double>_>).
                       _M_impl.super__Vector_impl_data._M_finish) {
        in_stack_fffffffffffffef8 = (vector<long_double,_std::allocator<long_double>_> *)0x0;
        in_stack_ffffffffffffff2f =
             sptk::ReadStream<long_double>
                       (SUB81((ulong)in_stack_ffffffffffffff60._M_current >> 0x30,0),
                        (int)in_stack_ffffffffffffff60._M_current,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,in_RDI,input_stream_00,
                        (int *)in_stack_ffffffffffffff70._M_current);
        if ((bool)in_stack_ffffffffffffff2f) goto LAB_0010c1b4;
LAB_0010c380:
        if (local_28 != 0) {
          in_stack_ffffffffffffff10 = std::istream::peek();
          iVar1 = std::char_traits<char>::eof();
          bVar3 = false;
          if (in_stack_ffffffffffffff10 == iVar1) {
            iVar2 = std::istream::peek();
            iVar1 = std::char_traits<char>::eof();
            bVar3 = iVar2 == iVar1;
          }
          *(bool *)local_28 = bVar3;
        }
        local_1 = 1;
        goto LAB_0010c3fc;
      }
LAB_0010c1b4:
      if (((ulong)in_RDI[1].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish & 1) == 0) {
        in_stack_fffffffffffffef8 = (vector<long_double,_std::allocator<long_double>_> *)0x0;
        in_stack_ffffffffffffff17 =
             sptk::ReadStream<long_double>
                       (SUB81((ulong)in_stack_ffffffffffffff60._M_current >> 0x30,0),
                        (int)in_stack_ffffffffffffff60._M_current,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,in_RDI,input_stream_00,
                        (int *)in_stack_ffffffffffffff70._M_current);
        if (!(bool)in_stack_ffffffffffffff17) goto LAB_0010c380;
      }
      else {
        __result._M_current =
             (longdouble *)
             &in_RDI[1].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        std::vector<long_double,_std::allocator<long_double>_>::begin(in_stack_fffffffffffffef8);
        std::vector<long_double,_std::allocator<long_double>_>::end(in_stack_fffffffffffffef8);
        std::vector<long_double,_std::allocator<long_double>_>::begin(in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff70 =
             __gnu_cxx::
             __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
             ::operator+((__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         in_stack_ffffffffffffff00);
        __first._M_current._7_1_ = in_stack_ffffffffffffff2f;
        __first._M_current._0_7_ = in_stack_ffffffffffffff28;
        in_stack_ffffffffffffff20 =
             std::
             copy<__gnu_cxx::__normal_iterator<long_double_const*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
                       (__first,in_stack_ffffffffffffff20._M_current,__result);
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff20;
      }
      bVar3 = SUB81((ulong)in_stack_ffffffffffffff60._M_current >> 0x30,0);
      if (*(int *)&in_RDI[1].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                   super__Vector_impl_data._M_start < 1) {
        if (0 < *(int *)((long)&in_RDI[1].
                                super__Vector_base<long_double,_std::allocator<long_double>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4)) {
          in_stack_fffffffffffffef8 = (vector<long_double,_std::allocator<long_double>_> *)0x0;
          in_stack_ffffffffffffff15 =
               sptk::ReadStream<long_double>
                         (bVar3,(int)in_stack_ffffffffffffff60._M_current,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58,in_RDI,input_stream_00,
                          (int *)in_stack_ffffffffffffff70._M_current);
          bVar3 = (bool)in_stack_ffffffffffffff15;
          goto joined_r0x0010c32b;
        }
      }
      else {
        in_stack_fffffffffffffef8 = (vector<long_double,_std::allocator<long_double>_> *)0x0;
        in_stack_ffffffffffffff16 =
             sptk::ReadStream<long_double>
                       (bVar3,(int)in_stack_ffffffffffffff60._M_current,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,in_RDI,input_stream_00,
                        (int *)in_stack_ffffffffffffff70._M_current);
        bVar3 = (bool)in_stack_ffffffffffffff16;
joined_r0x0010c32b:
        if (!bVar3) goto LAB_0010c380;
      }
      in_stack_ffffffffffffff14 =
           sptk::WriteStream<long_double>
                     ((int)in_RDI,(int)((ulong)input_stream_00 >> 0x20),sequence_to_write,
                      output_stream,actual_write_size);
    } while ((bool)in_stack_ffffffffffffff14);
    local_1 = 0;
LAB_0010c3fc:
    std::vector<long_double,_std::allocator<long_double>_>::~vector
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::vector<long_double,_std::allocator<long_double>_>::~vector
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Run(std::istream* input_stream, std::istream* insert_stream,
           bool* eof_reached) const override {
    if (recursive_ && !has_vector_) {
      return true;
    }

    std::vector<T> merged_vector(merged_length_);
    std::vector<T> garbage(input_skip_length_);
    for (;;) {
      if (0 < insert_point_) {
        if (!sptk::ReadStream(false, 0, 0, insert_point_, &merged_vector,
                              input_stream, NULL)) {
          break;
        }
      }
      if (recursive_) {
        std::copy(insert_vector_.begin(), insert_vector_.end(),
                  merged_vector.begin() + insert_point_);
      } else if (!sptk::ReadStream(false, 0, insert_point_, insert_length_,
                                   &merged_vector, insert_stream, NULL)) {
        break;
      }
      if (0 < input_rest_length_) {
        if (!sptk::ReadStream(
                false, input_skip_length_, insert_point_ + insert_length_,
                input_rest_length_, &merged_vector, input_stream, NULL)) {
          break;
        }
      } else if (0 < input_skip_length_) {
        if (!sptk::ReadStream(false, 0, 0, input_skip_length_, &garbage,
                              input_stream, NULL)) {
          break;
        }
      }
      if (!sptk::WriteStream(0, merged_length_, merged_vector, &std::cout,
                             NULL)) {
        return false;
      }
    }

    if (NULL != eof_reached) {
      *eof_reached =
          (input_stream->peek() == std::istream::traits_type::eof() &&
           insert_stream->peek() == std::istream::traits_type::eof());
    }
    return true;
  }